

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_cursor.hpp
# Opt level: O2

void __thiscall
jsoncons::cbor::basic_cbor_cursor<jsoncons::bytes_source,std::allocator<char>>::
basic_cbor_cursor<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
          (basic_cbor_cursor<jsoncons::bytes_source,std::allocator<char>> *this,
          allocator<char> *param_2,vector<unsigned_char,_std::allocator<unsigned_char>_> *param_3,
          cbor_decode_options *param_4,undefined8 param_5)

{
  char cVar1;
  
  *(undefined8 *)this = 0x999d98;
  *(undefined8 *)(this + 0x238) = 0x999e38;
  basic_cbor_parser<jsoncons::bytes_source,std::allocator<char>>::
  basic_cbor_parser<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
            ((basic_cbor_parser<jsoncons::bytes_source,std::allocator<char>> *)(this + 8),param_3,
             param_4,param_2);
  *(undefined ***)(this + 0x100) = &PTR__basic_json_visitor_00998270;
  *(undefined2 *)(this + 0x108) = 3;
  *(undefined4 *)(this + 0x130) = 0;
  *(undefined8 *)(this + 0x110) = 0;
  *(undefined8 *)(this + 0x118) = 0;
  *(undefined8 *)(this + 0x11c) = 0;
  *(undefined8 *)(this + 0x124) = 0;
  *(undefined8 *)(this + 0x138) = 0;
  *(undefined8 *)(this + 0x140) = 0;
  *(undefined8 *)(this + 0x148) = 0;
  *(undefined8 *)(this + 0x150) = 0;
  *(undefined8 *)(this + 0x158) = 0;
  basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::
  basic_item_event_visitor_to_json_visitor
            ((basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_> *)(this + 0x160)
             ,(basic_json_visitor<char> *)(this + 0x100),param_2);
  this[0x230] = (basic_cbor_cursor<jsoncons::bytes_source,std::allocator<char>>)0x0;
  this[0x12] = (basic_cbor_cursor<jsoncons::bytes_source,std::allocator<char>>)0x1;
  cVar1 = (**(code **)(*(long *)this + 0x18))(this);
  if (cVar1 == '\0') {
    (**(code **)(*(long *)this + 0x40))(this,param_5);
  }
  return;
}

Assistant:

basic_cbor_cursor(std::allocator_arg_t, const Allocator& alloc, 
        Sourceable&& source,
        const cbor_decode_options& options,
        std::error_code& ec)
       : parser_(std::forward<Sourceable>(source), options, alloc), 
         cursor_handler_adaptor_(cursor_visitor_, alloc),
         eof_(false)
    {
        parser_.cursor_mode(true);
        if (!done())
        {
            next(ec);
        }
    }